

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O3

void __thiscall
QtConcurrent::ThreadEngineBase::handleException(ThreadEngineBase *this,QException *exception)

{
  QBasicMutex *pQVar1;
  __pointer_type pQVar2;
  char cVar3;
  bool bVar4;
  
  if ((QException *)this->futureInterface != (QException *)0x0) {
    QFutureInterfaceBase::reportException((QException *)this->futureInterface);
    return;
  }
  pQVar1 = &this->mutex;
  if ((this->mutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar4 = (pQVar1->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar4) {
      (pQVar1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar4) goto LAB_00102e14;
  }
  QBasicMutex::lockInternal();
LAB_00102e14:
  cVar3 = QtPrivate::ExceptionStore::hasException();
  if (cVar3 == '\0') {
    QtPrivate::ExceptionStore::setException((QException *)&this->exceptionStore);
  }
  LOCK();
  pQVar2 = (pQVar1->d_ptr)._q_value._M_b._M_p;
  (pQVar1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar2 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar1);
    return;
  }
  return;
}

Assistant:

void ThreadEngineBase::handleException(const QException &exception)
{
    if (futureInterface) {
        futureInterface->reportException(exception);
    } else {
        QMutexLocker lock(&mutex);
        if (!exceptionStore.hasException())
            exceptionStore.setException(exception);
    }
}